

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lesson.h
# Opt level: O2

void __thiscall
Lesson::Lesson(Lesson *this,size_t lesson_id,bool exist,bool doubled,bool moveable,string *subject,
              string *room,string *professor,string *time)

{
  this->lesson_id = lesson_id;
  this->exist = exist;
  this->doubled = doubled;
  this->moveable = moveable;
  std::__cxx11::string::string((string *)&this->subject,(string *)subject);
  std::__cxx11::string::string((string *)&this->room,(string *)room);
  std::__cxx11::string::string((string *)&this->professor,(string *)professor);
  (this->prep_list).super__Vector_base<Professor,_std::allocator<Professor>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->prep_list).super__Vector_base<Professor,_std::allocator<Professor>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->prep_list).super__Vector_base<Professor,_std::allocator<Professor>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&this->time,(string *)time);
  return;
}

Assistant:

Lesson(size_t lesson_id = 0, bool exist = false, bool doubled = false, bool moveable = false, std::string subject = "" ,std::string room = "", std::string professor = "", std::string time = "") :
            lesson_id(lesson_id),
            doubled(doubled),
            moveable(moveable),
            exist(exist),
            subject(subject),
            room(room),
            professor(professor),
            prep_list(),
            time(time)
            { }